

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_lit_errorfn(arg_lit *parent,FILE *fp,int errorcode,char *argval,char *progname)

{
  char *shortopts_00;
  char *longopts_00;
  char *datatype_00;
  char *datatype;
  char *longopts;
  char *shortopts;
  char *progname_local;
  char *argval_local;
  int errorcode_local;
  FILE *fp_local;
  arg_lit *parent_local;
  
  shortopts_00 = (parent->hdr).shortopts;
  longopts_00 = (parent->hdr).longopts;
  datatype_00 = (parent->hdr).datatype;
  if (errorcode == 1) {
    fprintf((FILE *)fp,"%s: missing option ",progname);
    arg_print_option(fp,shortopts_00,longopts_00,datatype_00,"\n");
    fprintf((FILE *)fp,"\n");
  }
  else if (errorcode == 2) {
    fprintf((FILE *)fp,"%s: extraneous option ",progname);
    arg_print_option(fp,shortopts_00,longopts_00,datatype_00,"\n");
  }
  return;
}

Assistant:

static void arg_lit_errorfn(
	struct arg_lit * parent,
	FILE * fp,
	int errorcode,
	const char * argval,
	const char * progname) {
	const char * shortopts = parent->hdr.shortopts;
	const char * longopts  = parent->hdr.longopts;
	const char * datatype  = parent->hdr.datatype;

	switch (errorcode) {
		case EMINCOUNT:
			fprintf(fp, "%s: missing option ", progname);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			fprintf(fp, "\n");
			break;

		case EMAXCOUNT:
			fprintf(fp, "%s: extraneous option ", progname);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;
	}

	ARG_TRACE(("%s:errorfn(%p, %p, %d, %s, %s)\n", __FILE__, parent, fp,
			   errorcode, argval, progname));
}